

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatingDisplay.cpp
# Opt level: O2

void __thiscall FloatingDisplay::saveSettings(FloatingDisplay *this)

{
  Master *this_00;
  QSettings *pQVar1;
  double dVar2;
  QArrayDataPointer<char16_t> QStack_48;
  QVariant local_30;
  
  this_00 = Master::getInstance();
  pQVar1 = Master::getSettings(this_00);
  QString::QString((QString *)&QStack_48,"FloatingDisplay/geometry");
  QVariant::QVariant(&local_30,(QRect *)(*(long *)&this->field_0x20 + 0x14));
  QSettings::setValue((QString *)pQVar1,(QVariant *)&QStack_48);
  QVariant::~QVariant(&local_30);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_48);
  QString::QString((QString *)&QStack_48,"FloatingDisplay/opacity");
  dVar2 = (double)QWidget::windowOpacity();
  QVariant::QVariant(&local_30,
                     (int)((double)((ulong)(dVar2 * 100.0) & 0x8000000000000000 |
                                   (ulong)DAT_00171bd0) + dVar2 * 100.0));
  QSettings::setValue((QString *)pQVar1,(QVariant *)&QStack_48);
  QVariant::~QVariant(&local_30);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_48);
  return;
}

Assistant:

void FloatingDisplay::saveSettings() {
	QSettings *settings = Master::getInstance()->getSettings();
	settings->setValue("FloatingDisplay/geometry", geometry());
	settings->setValue("FloatingDisplay/opacity", qRound(windowOpacity() * 100.0));
}